

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * vformat_abi_cxx11_(string *__return_storage_ptr__,char *fmt,__va_list_tag *args)

{
  size_t sVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  size_type local_78;
  size_t size;
  undefined8 uStack_68;
  int res;
  va_list args2;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> result;
  __va_list_tag *args_local;
  char *fmt_local;
  
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = args;
  sVar1 = strlen(fmt);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,sVar1 * 2,&local_39);
  std::allocator<char>::~allocator(&local_39);
  do {
    args2[0].overflow_arg_area =
         *(void **)(result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x10);
    uStack_68 = *(undefined8 *)result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_
    ;
    args2[0]._0_8_ =
         *(undefined8 *)(result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 8);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_38);
    size._4_4_ = vsnprintf(pcVar2,sVar3,fmt,&stack0xffffffffffffff98);
    if (-1 < size._4_4_) {
      uVar4 = (ulong)size._4_4_;
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_38);
      if (uVar4 < sVar3) {
        pcVar2 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)local_38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)((long)&size + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)&size + 3));
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_38);
        return __return_storage_ptr__;
      }
    }
    if (size._4_4_ < 0) {
      local_78 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_38);
      local_78 = local_78 << 1;
    }
    else {
      local_78 = (long)size._4_4_ + 1;
    }
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)local_38)
    ;
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_38,local_78);
  } while( true );
}

Assistant:

std::string vformat(const char *fmt, va_list args) {
    std::vector<char> result(strlen(fmt) * 2);
    while (true) {
        va_list args2;
        va_copy(args2, args);
        int res = vsnprintf(result.data(), result.size(), fmt, args2);

        if ((res >= 0) && (static_cast<size_t>(res) < result.size())) {
            va_end(args);
            va_end(args2);
            return std::string(result.data());
        }

        size_t size;
        if (res < 0) {
            size = result.size() * 2;
        } else {
            size = static_cast<size_t>(res) + 1;
        }

        result.clear();
        result.resize(size);
        va_end(args2);
    }
}